

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genGroupRelationOrdering
          (string *__return_storage_ptr__,CppGenerator *this,string *rel_name,size_t *depth,
          size_t *group_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  char cVar6;
  long *plVar7;
  size_t sVar8;
  undefined8 *puVar9;
  ulong uVar10;
  size_type *psVar11;
  long *plVar12;
  ulong uVar13;
  undefined8 *puVar14;
  unsigned_long uVar15;
  Attribute *pAVar16;
  char cVar17;
  CppGenerator *this_00;
  ulong *puVar18;
  string *psVar19;
  string second;
  string secondID;
  string first;
  string firstID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string __str_7;
  string depthString;
  string attrType;
  string __str_6;
  string __str_5;
  ulong *local_980;
  long local_978;
  ulong local_970;
  long lStack_968;
  ulong *local_960;
  long local_958;
  ulong local_950;
  long lStack_948;
  long *local_940;
  long local_938;
  long local_930;
  long lStack_928;
  long *local_920;
  long local_918;
  long local_910;
  long lStack_908;
  ulong *local_900;
  long local_8f8;
  ulong local_8f0;
  long lStack_8e8;
  ulong *local_8e0;
  long local_8d8;
  ulong local_8d0;
  long lStack_8c8;
  ulong *local_8c0;
  long local_8b8;
  ulong local_8b0;
  long lStack_8a8;
  long *local_8a0;
  long local_898;
  long local_890;
  long lStack_888;
  string *local_880;
  ulong *local_878;
  long local_870;
  ulong local_868;
  long lStack_860;
  ulong *local_858;
  long local_850;
  ulong local_848;
  long lStack_840;
  ulong *local_838;
  long local_830;
  ulong local_828;
  long lStack_820;
  Attribute *local_818;
  long *local_810;
  long local_808;
  long local_800;
  long lStack_7f8;
  unsigned_long local_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7e8;
  size_t *local_7e0;
  ulong *local_7d8;
  long local_7d0;
  ulong local_7c8;
  long lStack_7c0;
  char *local_7b8;
  uint local_7b0;
  char local_7a8 [16];
  string local_798;
  long local_778;
  ulong *local_770;
  long local_768;
  ulong local_760;
  long lStack_758;
  ulong *local_750;
  long local_748;
  ulong local_740;
  long lStack_738;
  ulong *local_730;
  long local_728;
  ulong local_720;
  undefined8 uStack_718;
  undefined8 *local_710;
  undefined8 local_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  ulong *local_6f0;
  long local_6e8;
  ulong local_6e0;
  long lStack_6d8;
  ulong *local_6d0;
  long local_6c8;
  ulong local_6c0;
  long lStack_6b8;
  long *local_6b0;
  long local_6a8;
  long local_6a0;
  long lStack_698;
  long *local_690;
  long local_688;
  long local_680;
  long lStack_678;
  ulong *local_670;
  long local_668;
  ulong local_660;
  long lStack_658;
  ulong *local_650;
  long local_648;
  ulong local_640;
  long lStack_638;
  ulong *local_630;
  long local_628;
  ulong local_620;
  long lStack_618;
  ulong *local_610;
  long local_608;
  ulong local_600;
  long lStack_5f8;
  ulong *local_5f0;
  long local_5e8;
  ulong local_5e0;
  long lStack_5d8;
  ulong *local_5d0;
  long local_5c8;
  ulong local_5c0;
  long lStack_5b8;
  ulong *local_5b0;
  long local_5a8;
  ulong local_5a0;
  long lStack_598;
  ulong *local_590;
  long local_588;
  ulong local_580;
  long lStack_578;
  ulong *local_570;
  long local_568;
  ulong local_560;
  long lStack_558;
  ulong *local_550;
  long local_548;
  ulong local_540;
  long lStack_538;
  ulong *local_530;
  long local_528;
  ulong local_520 [2];
  undefined8 *local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 *local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 *local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 *local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 *local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 *local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  ulong *local_410;
  long local_408;
  ulong local_400 [2];
  ulong *local_3f0;
  long local_3e8;
  ulong local_3e0 [2];
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0 [2];
  ulong *local_3b0;
  long local_3a8;
  ulong local_3a0 [2];
  ulong *local_390;
  long local_388;
  ulong local_380 [2];
  ulong *local_370;
  long local_368;
  ulong local_360 [2];
  ulong *local_350;
  long local_348;
  ulong local_340 [2];
  ulong *local_330;
  long local_328;
  ulong local_320 [2];
  ulong *local_310;
  long local_308;
  ulong local_300 [2];
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0 [2];
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_7e0 = group_id;
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_798,(char)*depth * '\x03' + '\x06');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_798);
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    lVar5 = plVar7[3];
    paVar1->_M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p);
  }
  this_00 = (CppGenerator *)
            this->groupVariableOrder[*local_7e0].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[*depth];
  local_818 = TreeDecomposition::getAttribute
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (size_t)this_00);
  typeToStr_abi_cxx11_(&local_798,this_00,local_818->_type);
  uVar10 = *depth;
  cVar17 = '\x01';
  if (9 < uVar10) {
    uVar13 = uVar10;
    cVar6 = '\x04';
    do {
      cVar17 = cVar6;
      if (uVar13 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_00275858;
      }
      if (uVar13 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_00275858;
      }
      if (uVar13 < 10000) goto LAB_00275858;
      bVar4 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar6 = cVar17 + '\x04';
    } while (bVar4);
    cVar17 = cVar17 + '\x01';
  }
LAB_00275858:
  local_7b8 = local_7a8;
  std::__cxx11::string::_M_construct((ulong)&local_7b8,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_7b8,local_7b0,uVar10);
  sVar2 = *depth;
  sVar8 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  local_778 = (sVar8 + 2) * sVar2;
  local_7f0 = this->groupViewsPerVarInfo[*local_7e0].
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[local_778];
  local_880 = __return_storage_ptr__;
  local_7e8 = paVar1;
  if (local_7f0 == 2) {
    local_900 = &local_8f0;
    local_8f8 = 0;
    local_8f0 = local_8f0 & 0xffffffffffffff00;
    local_8c0 = &local_8b0;
    local_8b8 = 0;
    local_8b0 = local_8b0 & 0xffffffffffffff00;
    sVar2 = this->groupViewsPerVarInfo[*local_7e0].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_778 + 1];
    sVar8 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar2 == sVar8) {
      local_8a0 = &local_890;
      pcVar3 = (rel_name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8a0,pcVar3,pcVar3 + rel_name->_M_string_length);
      pAVar16 = local_818;
      std::__cxx11::string::append((char *)&local_8a0);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_8a0,(ulong)(rel_name->_M_dataplus)._M_p);
      local_8e0 = &local_8d0;
      puVar18 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar18) {
        local_8d0 = *puVar18;
        lStack_8c8 = plVar7[3];
      }
      else {
        local_8d0 = *puVar18;
        local_8e0 = (ulong *)*plVar7;
      }
      local_8d8 = plVar7[1];
      *plVar7 = (long)puVar18;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_8e0);
      local_940 = &local_930;
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_930 = *plVar12;
        lStack_928 = plVar7[3];
      }
      else {
        local_930 = *plVar12;
        local_940 = (long *)*plVar7;
      }
      local_938 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_940,(ulong)local_7b8);
      puVar18 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar18) {
        local_950 = *puVar18;
        lStack_948 = plVar7[3];
        local_960 = &local_950;
      }
      else {
        local_950 = *puVar18;
        local_960 = (ulong *)*plVar7;
      }
      local_958 = plVar7[1];
      *plVar7 = (long)puVar18;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_960);
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_910 = *plVar12;
        lStack_908 = plVar7[3];
        local_920 = &local_910;
      }
      else {
        local_910 = *plVar12;
        local_920 = (long *)*plVar7;
      }
      local_918 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_920,(ulong)(pAVar16->_name)._M_dataplus._M_p);
      puVar18 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar18) {
        local_970 = *puVar18;
        lStack_968 = plVar7[3];
        local_980 = &local_970;
      }
      else {
        local_970 = *puVar18;
        local_980 = (ulong *)*plVar7;
      }
      local_978 = plVar7[1];
      *plVar7 = (long)puVar18;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_900,(string *)&local_980);
      if (local_980 != &local_970) {
        operator_delete(local_980);
      }
      if (local_920 != &local_910) {
        operator_delete(local_920);
      }
      if (local_960 != &local_950) {
        operator_delete(local_960);
      }
      if (local_940 != &local_930) {
        operator_delete(local_940);
      }
      if (local_8e0 != &local_8d0) {
        operator_delete(local_8e0);
      }
      if (local_8a0 != &local_890) {
        operator_delete(local_8a0);
      }
      pcVar3 = (rel_name->_M_dataplus)._M_p;
      local_980 = &local_970;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_980,pcVar3,pcVar3 + rel_name->_M_string_length);
      std::__cxx11::string::append((char *)&local_980);
    }
    else {
      uVar15 = this->groupViewsPerVarInfo[*local_7e0].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[local_778 + 1];
      local_8a0 = &local_890;
      pcVar3 = this->viewName[uVar15]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8a0,pcVar3,pcVar3 + this->viewName[uVar15]._M_string_length);
      pAVar16 = local_818;
      std::__cxx11::string::append((char *)&local_8a0);
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_8a0,(ulong)this->viewName[uVar15]._M_dataplus._M_p);
      local_8e0 = &local_8d0;
      puVar18 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar18) {
        local_8d0 = *puVar18;
        lStack_8c8 = puVar9[3];
      }
      else {
        local_8d0 = *puVar18;
        local_8e0 = (ulong *)*puVar9;
      }
      local_8d8 = puVar9[1];
      *puVar9 = puVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_8e0);
      local_940 = &local_930;
      plVar7 = puVar9 + 2;
      if ((long *)*puVar9 == plVar7) {
        local_930 = *plVar7;
        lStack_928 = puVar9[3];
      }
      else {
        local_930 = *plVar7;
        local_940 = (long *)*puVar9;
      }
      local_938 = puVar9[1];
      *puVar9 = plVar7;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_940,(ulong)local_7b8);
      puVar18 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar18) {
        local_950 = *puVar18;
        lStack_948 = puVar9[3];
        local_960 = &local_950;
      }
      else {
        local_950 = *puVar18;
        local_960 = (ulong *)*puVar9;
      }
      local_958 = puVar9[1];
      *puVar9 = puVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_960);
      plVar7 = puVar9 + 2;
      if ((long *)*puVar9 == plVar7) {
        local_910 = *plVar7;
        lStack_908 = puVar9[3];
        local_920 = &local_910;
      }
      else {
        local_910 = *plVar7;
        local_920 = (long *)*puVar9;
      }
      local_918 = puVar9[1];
      *puVar9 = plVar7;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_920,(ulong)(pAVar16->_name)._M_dataplus._M_p);
      puVar18 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar18) {
        local_970 = *puVar18;
        lStack_968 = puVar9[3];
        local_980 = &local_970;
      }
      else {
        local_970 = *puVar18;
        local_980 = (ulong *)*puVar9;
      }
      local_978 = puVar9[1];
      *puVar9 = puVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_900,(string *)&local_980);
      if (local_980 != &local_970) {
        operator_delete(local_980);
      }
      if (local_920 != &local_910) {
        operator_delete(local_920);
      }
      if (local_960 != &local_950) {
        operator_delete(local_960);
      }
      if (local_940 != &local_930) {
        operator_delete(local_940);
      }
      if (local_8e0 != &local_8d0) {
        operator_delete(local_8e0);
      }
      if (local_8a0 != &local_890) {
        operator_delete(local_8a0);
      }
      pcVar3 = this->viewName[uVar15]._M_dataplus._M_p;
      local_980 = &local_970;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_980,pcVar3,pcVar3 + this->viewName[uVar15]._M_string_length);
      std::__cxx11::string::append((char *)&local_980);
    }
    std::__cxx11::string::operator=((string *)&local_8c0,(string *)&local_980);
    if (local_980 != &local_970) {
      operator_delete(local_980);
    }
    uVar15 = this->groupViewsPerVarInfo[*local_7e0].
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[local_778 + 2];
    pcVar3 = this->viewName[uVar15]._M_dataplus._M_p;
    local_8a0 = &local_890;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8a0,pcVar3,pcVar3 + this->viewName[uVar15]._M_string_length);
    std::__cxx11::string::append((char *)&local_8a0);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_8a0,(ulong)this->viewName[uVar15]._M_dataplus._M_p);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_8d0 = *puVar18;
      lStack_8c8 = plVar7[3];
      local_8e0 = &local_8d0;
    }
    else {
      local_8d0 = *puVar18;
      local_8e0 = (ulong *)*plVar7;
    }
    local_8d8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_8e0);
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_930 = *plVar12;
      lStack_928 = plVar7[3];
      local_940 = &local_930;
    }
    else {
      local_930 = *plVar12;
      local_940 = (long *)*plVar7;
    }
    local_938 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_940,(ulong)local_7b8);
    local_960 = &local_950;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_950 = *puVar18;
      lStack_948 = plVar7[3];
    }
    else {
      local_950 = *puVar18;
      local_960 = (ulong *)*plVar7;
    }
    local_958 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_960);
    plVar7 = puVar9 + 2;
    if ((long *)*puVar9 == plVar7) {
      local_910 = *plVar7;
      lStack_908 = puVar9[3];
      local_920 = &local_910;
    }
    else {
      local_910 = *plVar7;
      local_920 = (long *)*puVar9;
    }
    local_918 = puVar9[1];
    *puVar9 = plVar7;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_920,(ulong)(local_818->_name)._M_dataplus._M_p);
    local_980 = &local_970;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_970 = *puVar18;
      lStack_968 = plVar7[3];
    }
    else {
      local_970 = *puVar18;
      local_980 = (ulong *)*plVar7;
    }
    local_978 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_920 != &local_910) {
      operator_delete(local_920);
    }
    if (local_960 != &local_950) {
      operator_delete(local_960);
    }
    if (local_940 != &local_930) {
      operator_delete(local_940);
    }
    if (local_8e0 != &local_8d0) {
      operator_delete(local_8e0);
    }
    if (local_8a0 != &local_890) {
      operator_delete(local_8a0);
    }
    pcVar3 = this->viewName[uVar15]._M_dataplus._M_p;
    local_920 = &local_910;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_920,pcVar3,pcVar3 + this->viewName[uVar15]._M_string_length);
    std::__cxx11::string::append((char *)&local_920);
    pAVar16 = local_818;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)*depth * '\x03' + '\x06');
    plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
    local_2d0 = &local_2c0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_2c0 = *plVar12;
      lStack_2b8 = plVar7[3];
    }
    else {
      local_2c0 = *plVar12;
      local_2d0 = (long *)*plVar7;
    }
    local_2c8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_2d0,(ulong)local_798._M_dataplus._M_p);
    local_2b0 = &local_2a0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_2a0 = *plVar12;
      lStack_298 = plVar7[3];
    }
    else {
      local_2a0 = *plVar12;
      local_2b0 = (long *)*plVar7;
    }
    local_2a8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_290 = &local_280;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_280 = *plVar12;
      lStack_278 = plVar7[3];
    }
    else {
      local_280 = *plVar12;
      local_290 = (long *)*plVar7;
    }
    local_288 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_290,(ulong)(pAVar16->_name)._M_dataplus._M_p);
    local_270 = &local_260;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_260 = *plVar12;
      lStack_258 = plVar7[3];
    }
    else {
      local_260 = *plVar12;
      local_270 = (long *)*plVar7;
    }
    local_268 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_640 = *puVar18;
      lStack_638 = plVar7[3];
      local_650 = &local_640;
    }
    else {
      local_640 = *puVar18;
      local_650 = (ulong *)*plVar7;
    }
    local_648 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_530 = local_520;
    std::__cxx11::string::_M_construct((ulong)&local_530,'\x01');
    *(undefined1 *)local_530 = 0x32;
    uVar10 = 0xf;
    if (local_650 != &local_640) {
      uVar10 = local_640;
    }
    if (uVar10 < (ulong)(local_528 + local_648)) {
      uVar10 = 0xf;
      if (local_530 != local_520) {
        uVar10 = local_520[0];
      }
      if (uVar10 < (ulong)(local_528 + local_648)) goto LAB_00276720;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_530,0,(char *)0x0,(ulong)local_650);
    }
    else {
LAB_00276720:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_650,(ulong)local_530);
    }
    local_510 = &local_500;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_500 = *puVar14;
      uStack_4f8 = puVar9[3];
    }
    else {
      local_500 = *puVar14;
      local_510 = (undefined8 *)*puVar9;
    }
    local_508 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_510);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_620 = *puVar18;
      lStack_618 = plVar7[3];
      local_630 = &local_620;
    }
    else {
      local_620 = *puVar18;
      local_630 = (ulong *)*plVar7;
    }
    local_628 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_310 = local_300;
    std::__cxx11::string::_M_construct((ulong)&local_310,(char)*depth * '\x03' + '\x06');
    uVar10 = 0xf;
    if (local_630 != &local_620) {
      uVar10 = local_620;
    }
    if (uVar10 < (ulong)(local_308 + local_628)) {
      uVar10 = 0xf;
      if (local_310 != local_300) {
        uVar10 = local_300[0];
      }
      if (uVar10 < (ulong)(local_308 + local_628)) goto LAB_00276875;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_630);
    }
    else {
LAB_00276875:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_630,(ulong)local_310);
    }
    local_4f0 = &local_4e0;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_4e0 = *puVar14;
      uStack_4d8 = puVar9[3];
    }
    else {
      local_4e0 = *puVar14;
      local_4f0 = (undefined8 *)*puVar9;
    }
    local_4e8 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_4f0);
    local_250 = &local_240;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_240 = *plVar12;
      lStack_238 = plVar7[3];
    }
    else {
      local_240 = *plVar12;
      local_250 = (long *)*plVar7;
    }
    local_248 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_900);
    local_230 = &local_220;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_220 = *plVar12;
      lStack_218 = plVar7[3];
    }
    else {
      local_220 = *plVar12;
      local_230 = (long *)*plVar7;
    }
    local_228 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
    local_210 = &local_200;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_200 = *plVar12;
      lStack_1f8 = plVar7[3];
    }
    else {
      local_200 = *plVar12;
      local_210 = (long *)*plVar7;
    }
    local_208 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_980);
    local_1f0 = &local_1e0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_1e0 = *plVar12;
      lStack_1d8 = plVar7[3];
    }
    else {
      local_1e0 = *plVar12;
      local_1f0 = (long *)*plVar7;
    }
    local_1e8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_600 = *puVar18;
      lStack_5f8 = plVar7[3];
      local_610 = &local_600;
    }
    else {
      local_600 = *puVar18;
      local_610 = (ulong *)*plVar7;
    }
    local_608 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_330 = local_320;
    std::__cxx11::string::_M_construct((ulong)&local_330,(char)*depth * '\x03' + '\x06');
    uVar10 = 0xf;
    if (local_610 != &local_600) {
      uVar10 = local_600;
    }
    if (uVar10 < (ulong)(local_328 + local_608)) {
      uVar10 = 0xf;
      if (local_330 != local_320) {
        uVar10 = local_320[0];
      }
      if (uVar10 < (ulong)(local_328 + local_608)) goto LAB_00276b5a;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,(ulong)local_610);
    }
    else {
LAB_00276b5a:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_610,(ulong)local_330);
    }
    local_4d0 = &local_4c0;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_4c0 = *puVar14;
      uStack_4b8 = puVar9[3];
    }
    else {
      local_4c0 = *puVar14;
      local_4d0 = (undefined8 *)*puVar9;
    }
    local_4c8 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_4d0);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_5e0 = *puVar18;
      lStack_5d8 = plVar7[3];
      local_5f0 = &local_5e0;
    }
    else {
      local_5e0 = *puVar18;
      local_5f0 = (ulong *)*plVar7;
    }
    local_5e8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_350 = local_340;
    std::__cxx11::string::_M_construct((ulong)&local_350,(char)*depth * '\x03' + '\t');
    uVar10 = 0xf;
    if (local_5f0 != &local_5e0) {
      uVar10 = local_5e0;
    }
    if (uVar10 < (ulong)(local_348 + local_5e8)) {
      uVar10 = 0xf;
      if (local_350 != local_340) {
        uVar10 = local_340[0];
      }
      if (uVar10 < (ulong)(local_348 + local_5e8)) goto LAB_00276caf;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,(ulong)local_5f0);
    }
    else {
LAB_00276caf:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5f0,(ulong)local_350);
    }
    local_4b0 = &local_4a0;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_4a0 = *puVar14;
      uStack_498 = puVar9[3];
    }
    else {
      local_4a0 = *puVar14;
      local_4b0 = (undefined8 *)*puVar9;
    }
    local_4a8 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_4b0);
    local_1d0 = &local_1c0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_1c0 = *plVar12;
      lStack_1b8 = plVar7[3];
    }
    else {
      local_1c0 = *plVar12;
      local_1d0 = (long *)*plVar7;
    }
    local_1c8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1d0,(ulong)(pAVar16->_name)._M_dataplus._M_p);
    local_1b0 = &local_1a0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_1a0 = *plVar12;
      lStack_198 = plVar7[3];
    }
    else {
      local_1a0 = *plVar12;
      local_1b0 = (long *)*plVar7;
    }
    local_1a8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b0);
    local_190 = &local_180;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_180 = *plVar12;
      lStack_178 = plVar7[3];
    }
    else {
      local_180 = *plVar12;
      local_190 = (long *)*plVar7;
    }
    local_188 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_900);
    local_170 = &local_160;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_160 = *plVar12;
      lStack_158 = plVar7[3];
    }
    else {
      local_160 = *plVar12;
      local_170 = (long *)*plVar7;
    }
    local_168 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_170);
    local_150 = &local_140;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_140 = *plVar12;
      lStack_138 = plVar7[3];
    }
    else {
      local_140 = *plVar12;
      local_150 = (long *)*plVar7;
    }
    local_148 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_8c0);
    local_130 = &local_120;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_120 = *plVar12;
      lStack_118 = plVar7[3];
    }
    else {
      local_120 = *plVar12;
      local_130 = (long *)*plVar7;
    }
    local_128 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_5c0 = *puVar18;
      lStack_5b8 = plVar7[3];
      local_5d0 = &local_5c0;
    }
    else {
      local_5c0 = *puVar18;
      local_5d0 = (ulong *)*plVar7;
    }
    local_5c8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_370 = local_360;
    std::__cxx11::string::_M_construct((ulong)&local_370,(char)*depth * '\x03' + '\t');
    uVar10 = 0xf;
    if (local_5d0 != &local_5c0) {
      uVar10 = local_5c0;
    }
    if (uVar10 < (ulong)(local_368 + local_5c8)) {
      uVar10 = 0xf;
      if (local_370 != local_360) {
        uVar10 = local_360[0];
      }
      if (uVar10 < (ulong)(local_368 + local_5c8)) goto LAB_0027705d;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,(ulong)local_5d0);
    }
    else {
LAB_0027705d:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5d0,(ulong)local_370);
    }
    local_490 = &local_480;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_480 = *puVar14;
      uStack_478 = puVar9[3];
    }
    else {
      local_480 = *puVar14;
      local_490 = (undefined8 *)*puVar9;
    }
    local_488 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_490);
    local_110 = &local_100;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_100 = *plVar12;
      lStack_f8 = plVar7[3];
    }
    else {
      local_100 = *plVar12;
      local_110 = (long *)*plVar7;
    }
    local_108 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)(pAVar16->_name)._M_dataplus._M_p);
    local_f0 = &local_e0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_e0 = *plVar12;
      lStack_d8 = plVar7[3];
    }
    else {
      local_e0 = *plVar12;
      local_f0 = (long *)*plVar7;
    }
    local_e8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_d0 = &local_c0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_c0 = *plVar12;
      lStack_b8 = plVar7[3];
    }
    else {
      local_c0 = *plVar12;
      local_d0 = (long *)*plVar7;
    }
    local_c8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_980);
    local_b0 = &local_a0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_a0 = *plVar12;
      lStack_98 = plVar7[3];
    }
    else {
      local_a0 = *plVar12;
      local_b0 = (long *)*plVar7;
    }
    local_a8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_90 = &local_80;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_80 = *plVar12;
      lStack_78 = plVar7[3];
    }
    else {
      local_80 = *plVar12;
      local_90 = (long *)*plVar7;
    }
    local_88 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_920);
    local_70 = &local_60;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_60 = *plVar12;
      lStack_58 = plVar7[3];
    }
    else {
      local_60 = *plVar12;
      local_70 = (long *)*plVar7;
    }
    local_68 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_5a0 = *puVar18;
      lStack_598 = plVar7[3];
      local_5b0 = &local_5a0;
    }
    else {
      local_5a0 = *puVar18;
      local_5b0 = (ulong *)*plVar7;
    }
    local_5a8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_390 = local_380;
    std::__cxx11::string::_M_construct((ulong)&local_390,(char)*depth * '\x03' + '\x06');
    uVar10 = 0xf;
    if (local_5b0 != &local_5a0) {
      uVar10 = local_5a0;
    }
    if (uVar10 < (ulong)(local_388 + local_5a8)) {
      uVar10 = 0xf;
      if (local_390 != local_380) {
        uVar10 = local_380[0];
      }
      if (uVar10 < (ulong)(local_388 + local_5a8)) goto LAB_002773ff;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,(ulong)local_5b0);
    }
    else {
LAB_002773ff:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_390);
    }
    local_470 = &local_460;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_460 = *puVar14;
      uStack_458 = puVar9[3];
    }
    else {
      local_460 = *puVar14;
      local_470 = (undefined8 *)*puVar9;
    }
    local_468 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_470);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_580 = *puVar18;
      lStack_578 = plVar7[3];
      local_590 = &local_580;
    }
    else {
      local_580 = *puVar18;
      local_590 = (ulong *)*plVar7;
    }
    local_588 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_3b0 = local_3a0;
    std::__cxx11::string::_M_construct((ulong)&local_3b0,(char)*depth * '\x03' + '\x06');
    uVar10 = 0xf;
    if (local_590 != &local_580) {
      uVar10 = local_580;
    }
    if (uVar10 < (ulong)(local_3a8 + local_588)) {
      uVar10 = 0xf;
      if (local_3b0 != local_3a0) {
        uVar10 = local_3a0[0];
      }
      if (uVar10 < (ulong)(local_3a8 + local_588)) goto LAB_00277554;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)local_590);
    }
    else {
LAB_00277554:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_3b0);
    }
    local_450 = &local_440;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_440 = *puVar14;
      uStack_438 = puVar9[3];
    }
    else {
      local_440 = *puVar14;
      local_450 = (undefined8 *)*puVar9;
    }
    local_448 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_450);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_560 = *puVar18;
      lStack_558 = plVar7[3];
      local_570 = &local_560;
    }
    else {
      local_560 = *puVar18;
      local_570 = (ulong *)*plVar7;
    }
    local_568 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_3d0 = local_3c0;
    std::__cxx11::string::_M_construct((ulong)&local_3d0,(char)*depth * '\x03' + '\x06');
    uVar10 = 0xf;
    if (local_570 != &local_560) {
      uVar10 = local_560;
    }
    if (uVar10 < (ulong)(local_3c8 + local_568)) {
      uVar10 = 0xf;
      if (local_3d0 != local_3c0) {
        uVar10 = local_3c0[0];
      }
      if (uVar10 < (ulong)(local_3c8 + local_568)) goto LAB_002776a9;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,(ulong)local_570);
    }
    else {
LAB_002776a9:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_3d0);
    }
    local_430 = &local_420;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_420 = *puVar14;
      uStack_418 = puVar9[3];
    }
    else {
      local_420 = *puVar14;
      local_430 = (undefined8 *)*puVar9;
    }
    local_428 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_430);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_540 = *puVar18;
      lStack_538 = plVar7[3];
      local_550 = &local_540;
    }
    else {
      local_540 = *puVar18;
      local_550 = (ulong *)*plVar7;
    }
    local_548 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_3f0 = local_3e0;
    std::__cxx11::string::_M_construct((ulong)&local_3f0,(char)*depth * '\x03' + '\t');
    uVar10 = 0xf;
    if (local_550 != &local_540) {
      uVar10 = local_540;
    }
    if (uVar10 < (ulong)(local_3e8 + local_548)) {
      uVar10 = 0xf;
      if (local_3f0 != local_3e0) {
        uVar10 = local_3e0[0];
      }
      if (uVar10 < (ulong)(local_3e8 + local_548)) goto LAB_002777fe;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,(ulong)local_550);
    }
    else {
LAB_002777fe:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_3f0);
    }
    local_730 = &local_720;
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_720 = *puVar18;
      uStack_718 = puVar9[3];
    }
    else {
      local_720 = *puVar18;
      local_730 = (ulong *)*puVar9;
    }
    local_728 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)puVar18 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_730);
    local_6f0 = &local_6e0;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_6e0 = *puVar18;
      lStack_6d8 = plVar7[3];
    }
    else {
      local_6e0 = *puVar18;
      local_6f0 = (ulong *)*plVar7;
    }
    local_6e8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_6f0,(ulong)(pAVar16->_name)._M_dataplus._M_p);
    local_6d0 = &local_6c0;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_6c0 = *puVar18;
      lStack_6b8 = plVar7[3];
    }
    else {
      local_6c0 = *puVar18;
      local_6d0 = (ulong *)*plVar7;
    }
    local_6c8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_6d0);
    local_770 = &local_760;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_760 = *puVar18;
      lStack_758 = plVar7[3];
    }
    else {
      local_760 = *puVar18;
      local_770 = (ulong *)*plVar7;
    }
    local_768 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_770,(ulong)local_980);
    local_670 = &local_660;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_660 = *puVar18;
      lStack_658 = plVar7[3];
    }
    else {
      local_660 = *puVar18;
      local_670 = (ulong *)*plVar7;
    }
    local_668 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_670);
    local_6b0 = &local_6a0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_6a0 = *plVar12;
      lStack_698 = plVar7[3];
    }
    else {
      local_6a0 = *plVar12;
      local_6b0 = (long *)*plVar7;
    }
    local_6a8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_6b0,(ulong)local_920);
    local_690 = &local_680;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_680 = *plVar12;
      lStack_678 = plVar7[3];
    }
    else {
      local_680 = *plVar12;
      local_690 = (long *)*plVar7;
    }
    local_688 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_690);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_740 = *puVar18;
      lStack_738 = plVar7[3];
      local_750 = &local_740;
    }
    else {
      local_740 = *puVar18;
      local_750 = (ulong *)*plVar7;
    }
    local_748 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_410 = local_400;
    std::__cxx11::string::_M_construct((ulong)&local_410,(char)*depth * '\x03' + '\t');
    uVar10 = 0xf;
    if (local_750 != &local_740) {
      uVar10 = local_740;
    }
    if (uVar10 < (ulong)(local_408 + local_748)) {
      uVar10 = 0xf;
      if (local_410 != local_400) {
        uVar10 = local_400[0];
      }
      if (uVar10 < (ulong)(local_408 + local_748)) goto LAB_00277ba0;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,(ulong)local_750);
    }
    else {
LAB_00277ba0:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_750,(ulong)local_410);
    }
    local_710 = &local_700;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_700 = *puVar14;
      uStack_6f8 = puVar9[3];
    }
    else {
      local_700 = *puVar14;
      local_710 = (undefined8 *)*puVar9;
    }
    local_708 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_710);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_7c8 = *puVar18;
      lStack_7c0 = plVar7[3];
      local_7d8 = &local_7c8;
    }
    else {
      local_7c8 = *puVar18;
      local_7d8 = (ulong *)*plVar7;
    }
    local_7d0 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_7d8,(ulong)(pAVar16->_name)._M_dataplus._M_p);
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_848 = *puVar18;
      lStack_840 = puVar9[3];
      local_858 = &local_848;
    }
    else {
      local_848 = *puVar18;
      local_858 = (ulong *)*puVar9;
    }
    local_850 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_858);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_828 = *puVar18;
      lStack_820 = plVar7[3];
      local_838 = &local_828;
    }
    else {
      local_828 = *puVar18;
      local_838 = (ulong *)*plVar7;
    }
    local_830 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_838,(ulong)local_900);
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_800 = *plVar12;
      lStack_7f8 = plVar7[3];
      local_810 = &local_800;
    }
    else {
      local_800 = *plVar12;
      local_810 = (long *)*plVar7;
    }
    local_808 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_810);
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_868 = *puVar18;
      lStack_860 = plVar7[3];
      local_878 = &local_868;
    }
    else {
      local_868 = *puVar18;
      local_878 = (ulong *)*plVar7;
    }
    local_870 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_878,(ulong)local_8c0);
    local_8a0 = &local_890;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_890 = *plVar12;
      lStack_888 = plVar7[3];
    }
    else {
      local_890 = *plVar12;
      local_8a0 = (long *)*plVar7;
    }
    local_898 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_8a0);
    local_8e0 = &local_8d0;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_8d0 = *puVar18;
      lStack_8c8 = plVar7[3];
    }
    else {
      local_8d0 = *puVar18;
      local_8e0 = (ulong *)*plVar7;
    }
    local_8d8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_2f0 = local_2e0;
    std::__cxx11::string::_M_construct((ulong)&local_2f0,(char)*depth * '\x03' + '\x06');
    uVar10 = 0xf;
    if (local_8e0 != &local_8d0) {
      uVar10 = local_8d0;
    }
    if (uVar10 < (ulong)(local_2e8 + local_8d8)) {
      uVar10 = 0xf;
      if (local_2f0 != local_2e0) {
        uVar10 = local_2e0[0];
      }
      if (uVar10 < (ulong)(local_2e8 + local_8d8)) goto LAB_00277f64;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_8e0);
    }
    else {
LAB_00277f64:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8e0,(ulong)local_2f0);
    }
    local_940 = &local_930;
    plVar7 = puVar9 + 2;
    if ((long *)*puVar9 == plVar7) {
      local_930 = *plVar7;
      lStack_928 = puVar9[3];
    }
    else {
      local_930 = *plVar7;
      local_940 = (long *)*puVar9;
    }
    local_938 = puVar9[1];
    *puVar9 = plVar7;
    puVar9[1] = 0;
    *(undefined1 *)plVar7 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_940);
    local_960 = &local_950;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_950 = *puVar18;
      lStack_948 = plVar7[3];
    }
    else {
      local_950 = *puVar18;
      local_960 = (ulong *)*plVar7;
    }
    local_958 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_880,(ulong)local_960);
    if (local_960 != &local_950) {
      operator_delete(local_960);
    }
    if (local_940 != &local_930) {
      operator_delete(local_940);
    }
    if (local_2f0 != local_2e0) {
      operator_delete(local_2f0);
    }
    if (local_8e0 != &local_8d0) {
      operator_delete(local_8e0);
    }
    if (local_8a0 != &local_890) {
      operator_delete(local_8a0);
    }
    if (local_878 != &local_868) {
      operator_delete(local_878);
    }
    if (local_810 != &local_800) {
      operator_delete(local_810);
    }
    pAVar16 = local_818;
    if (local_838 != &local_828) {
      operator_delete(local_838);
    }
    if (local_858 != &local_848) {
      operator_delete(local_858);
    }
    if (local_7d8 != &local_7c8) {
      operator_delete(local_7d8);
    }
    if (local_710 != &local_700) {
      operator_delete(local_710);
    }
    if (local_410 != local_400) {
      operator_delete(local_410);
    }
    if (local_750 != &local_740) {
      operator_delete(local_750);
    }
    if (local_690 != &local_680) {
      operator_delete(local_690);
    }
    if (local_6b0 != &local_6a0) {
      operator_delete(local_6b0);
    }
    if (local_670 != &local_660) {
      operator_delete(local_670);
    }
    if (local_770 != &local_760) {
      operator_delete(local_770);
    }
    if (local_6d0 != &local_6c0) {
      operator_delete(local_6d0);
    }
    if (local_6f0 != &local_6e0) {
      operator_delete(local_6f0);
    }
    if (local_730 != &local_720) {
      operator_delete(local_730);
    }
    if (local_3f0 != local_3e0) {
      operator_delete(local_3f0);
    }
    if (local_550 != &local_540) {
      operator_delete(local_550);
    }
    if (local_430 != &local_420) {
      operator_delete(local_430);
    }
    if (local_3d0 != local_3c0) {
      operator_delete(local_3d0);
    }
    if (local_570 != &local_560) {
      operator_delete(local_570);
    }
    if (local_450 != &local_440) {
      operator_delete(local_450);
    }
    if (local_3b0 != local_3a0) {
      operator_delete(local_3b0);
    }
    if (local_590 != &local_580) {
      operator_delete(local_590);
    }
    if (local_470 != &local_460) {
      operator_delete(local_470);
    }
    if (local_390 != local_380) {
      operator_delete(local_390);
    }
    if (local_5b0 != &local_5a0) {
      operator_delete(local_5b0);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_490 != &local_480) {
      operator_delete(local_490);
    }
    if (local_370 != local_360) {
      operator_delete(local_370);
    }
    if (local_5d0 != &local_5c0) {
      operator_delete(local_5d0);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0);
    }
    if (local_4b0 != &local_4a0) {
      operator_delete(local_4b0);
    }
    if (local_350 != local_340) {
      operator_delete(local_350);
    }
    if (local_5f0 != &local_5e0) {
      operator_delete(local_5f0);
    }
    if (local_4d0 != &local_4c0) {
      operator_delete(local_4d0);
    }
    if (local_330 != local_320) {
      operator_delete(local_330);
    }
    if (local_610 != &local_600) {
      operator_delete(local_610);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250);
    }
    if (local_4f0 != &local_4e0) {
      operator_delete(local_4f0);
    }
    if (local_310 != local_300) {
      operator_delete(local_310);
    }
    if (local_630 != &local_620) {
      operator_delete(local_630);
    }
    if (local_510 != &local_500) {
      operator_delete(local_510);
    }
    if (local_530 != local_520) {
      operator_delete(local_530);
    }
    if (local_650 != &local_640) {
      operator_delete(local_650);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0);
    }
    if (local_2d0 != &local_2c0) {
      operator_delete(local_2d0);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (local_920 != &local_910) {
      operator_delete(local_920);
    }
    if (local_980 != &local_970) {
      operator_delete(local_980);
    }
    if (local_8c0 != &local_8b0) {
      operator_delete(local_8c0);
    }
    puVar18 = local_900;
    if (local_900 != &local_8f0) {
LAB_00278706:
      operator_delete(puVar18);
    }
  }
  else {
    local_810 = &local_800;
    std::__cxx11::string::_M_construct((ulong)&local_810,(char)*depth * '\x03' + '\x06');
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_810);
    pAVar16 = local_818;
    local_878 = &local_868;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_868 = *puVar18;
      lStack_860 = plVar7[3];
    }
    else {
      local_868 = *puVar18;
      local_878 = (ulong *)*plVar7;
    }
    local_870 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_878,(ulong)local_798._M_dataplus._M_p);
    local_8a0 = &local_890;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_890 = *plVar12;
      lStack_888 = plVar7[3];
    }
    else {
      local_890 = *plVar12;
      local_8a0 = (long *)*plVar7;
    }
    local_898 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_8a0);
    local_8e0 = &local_8d0;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_8d0 = *puVar18;
      lStack_8c8 = plVar7[3];
    }
    else {
      local_8d0 = *puVar18;
      local_8e0 = (ulong *)*plVar7;
    }
    local_8d8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_8e0,(ulong)(pAVar16->_name)._M_dataplus._M_p);
    local_940 = &local_930;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_930 = *plVar12;
      lStack_928 = plVar7[3];
    }
    else {
      local_930 = *plVar12;
      local_940 = (long *)*plVar7;
    }
    local_938 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_940);
    local_960 = &local_950;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_950 = *puVar18;
      lStack_948 = plVar7[3];
    }
    else {
      local_950 = *puVar18;
      local_960 = (ulong *)*plVar7;
    }
    local_958 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    cVar17 = '\x01';
    if (9 < local_7f0) {
      uVar15 = local_7f0;
      cVar6 = '\x04';
      do {
        cVar17 = cVar6;
        if (uVar15 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_00278ef7;
        }
        if (uVar15 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_00278ef7;
        }
        if (uVar15 < 10000) goto LAB_00278ef7;
        bVar4 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar6 = cVar17 + '\x04';
      } while (bVar4);
      cVar17 = cVar17 + '\x01';
    }
LAB_00278ef7:
    local_838 = &local_828;
    std::__cxx11::string::_M_construct((ulong)&local_838,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_838,(uint)local_830,local_7f0);
    uVar10 = 0xf;
    if (local_960 != &local_950) {
      uVar10 = local_950;
    }
    if (uVar10 < (ulong)(local_830 + local_958)) {
      uVar10 = 0xf;
      if (local_838 != &local_828) {
        uVar10 = local_828;
      }
      if (uVar10 < (ulong)(local_830 + local_958)) goto LAB_00278f86;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_838,0,(char *)0x0,(ulong)local_960);
    }
    else {
LAB_00278f86:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_960,(ulong)local_838);
    }
    local_920 = &local_910;
    plVar7 = puVar9 + 2;
    if ((long *)*puVar9 == plVar7) {
      local_910 = *plVar7;
      lStack_908 = puVar9[3];
    }
    else {
      local_910 = *plVar7;
      local_920 = (long *)*puVar9;
    }
    local_918 = puVar9[1];
    *puVar9 = plVar7;
    puVar9[1] = 0;
    *(undefined1 *)plVar7 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_920);
    local_980 = &local_970;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_970 = *puVar18;
      lStack_968 = plVar7[3];
    }
    else {
      local_970 = *puVar18;
      local_980 = (ulong *)*plVar7;
    }
    local_978 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_858 = &local_848;
    std::__cxx11::string::_M_construct((ulong)&local_858,(char)*depth * '\x03' + '\t');
    uVar10 = 0xf;
    if (local_980 != &local_970) {
      uVar10 = local_970;
    }
    if (uVar10 < (ulong)(local_850 + local_978)) {
      uVar10 = 0xf;
      if (local_858 != &local_848) {
        uVar10 = local_848;
      }
      if (uVar10 < (ulong)(local_850 + local_978)) goto LAB_002790b8;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_858,0,(char *)0x0,(ulong)local_980);
    }
    else {
LAB_002790b8:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_980,(ulong)local_858);
    }
    local_8c0 = &local_8b0;
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_8b0 = *puVar18;
      lStack_8a8 = puVar9[3];
    }
    else {
      local_8b0 = *puVar18;
      local_8c0 = (ulong *)*puVar9;
    }
    local_8b8 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)puVar18 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_8c0);
    local_900 = &local_8f0;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_8f0 = *puVar18;
      lStack_8e8 = plVar7[3];
    }
    else {
      local_8f0 = *puVar18;
      local_900 = (ulong *)*plVar7;
    }
    local_8f8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_900);
    if (local_900 != &local_8f0) {
      operator_delete(local_900);
    }
    if (local_8c0 != &local_8b0) {
      operator_delete(local_8c0);
    }
    if (local_858 != &local_848) {
      operator_delete(local_858);
    }
    if (local_980 != &local_970) {
      operator_delete(local_980);
    }
    if (local_920 != &local_910) {
      operator_delete(local_920);
    }
    if (local_838 != &local_828) {
      operator_delete(local_838);
    }
    if (local_960 != &local_950) {
      operator_delete(local_960);
    }
    if (local_940 != &local_930) {
      operator_delete(local_940);
    }
    if (local_8e0 != &local_8d0) {
      operator_delete(local_8e0);
    }
    if (local_8a0 != &local_890) {
      operator_delete(local_8a0);
    }
    if (local_878 != &local_868) {
      operator_delete(local_878);
    }
    if (local_810 != &local_800) {
      operator_delete(local_810);
    }
    sVar2 = this->groupViewsPerVarInfo[*local_7e0].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_778 + 1];
    sVar8 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    psVar19 = local_880;
    uVar10 = 1;
    if (sVar2 == sVar8) {
      local_7d8 = &local_7c8;
      std::__cxx11::string::_M_construct((ulong)&local_7d8,(char)*depth * '\x03' + '\f');
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_7d8,0,(char *)0x0,0x2afdd1);
      local_858 = &local_848;
      puVar18 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar18) {
        local_848 = *puVar18;
        lStack_840 = plVar7[3];
      }
      else {
        local_848 = *puVar18;
        local_858 = (ulong *)*plVar7;
      }
      local_850 = plVar7[1];
      *plVar7 = (long)puVar18;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_858);
      local_838 = &local_828;
      puVar18 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar18) {
        local_828 = *puVar18;
        lStack_820 = plVar7[3];
      }
      else {
        local_828 = *puVar18;
        local_838 = (ulong *)*plVar7;
      }
      local_830 = plVar7[1];
      *plVar7 = (long)puVar18;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_838,(ulong)(rel_name->_M_dataplus)._M_p);
      local_810 = &local_800;
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_800 = *plVar12;
        lStack_7f8 = plVar7[3];
      }
      else {
        local_800 = *plVar12;
        local_810 = (long *)*plVar7;
      }
      local_808 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_810);
      local_878 = &local_868;
      puVar18 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar18) {
        local_868 = *puVar18;
        lStack_860 = puVar9[3];
      }
      else {
        local_868 = *puVar18;
        local_878 = (ulong *)*puVar9;
      }
      local_870 = puVar9[1];
      *puVar9 = puVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_878,(ulong)(rel_name->_M_dataplus)._M_p);
      local_8a0 = &local_890;
      plVar7 = puVar9 + 2;
      if ((long *)*puVar9 == plVar7) {
        local_890 = *plVar7;
        lStack_888 = puVar9[3];
      }
      else {
        local_890 = *plVar7;
        local_8a0 = (long *)*puVar9;
      }
      local_898 = puVar9[1];
      *puVar9 = plVar7;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_8a0);
      local_8e0 = &local_8d0;
      puVar18 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar18) {
        local_8d0 = *puVar18;
        lStack_8c8 = puVar9[3];
      }
      else {
        local_8d0 = *puVar18;
        local_8e0 = (ulong *)*puVar9;
      }
      local_8d8 = puVar9[1];
      *puVar9 = puVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8e0,(ulong)local_7b8);
      local_940 = &local_930;
      plVar7 = puVar9 + 2;
      if ((long *)*puVar9 == plVar7) {
        local_930 = *plVar7;
        lStack_928 = puVar9[3];
      }
      else {
        local_930 = *plVar7;
        local_940 = (long *)*puVar9;
      }
      local_938 = puVar9[1];
      *puVar9 = plVar7;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_940);
      local_960 = &local_950;
      puVar18 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar18) {
        local_950 = *puVar18;
        lStack_948 = puVar9[3];
      }
      else {
        local_950 = *puVar18;
        local_960 = (ulong *)*puVar9;
      }
      local_958 = puVar9[1];
      *puVar9 = puVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_960,(ulong)(local_818->_name)._M_dataplus._M_p);
      local_920 = &local_910;
      plVar7 = puVar9 + 2;
      if ((long *)*puVar9 == plVar7) {
        local_910 = *plVar7;
        lStack_908 = puVar9[3];
      }
      else {
        local_910 = *plVar7;
        local_920 = (long *)*puVar9;
      }
      local_918 = puVar9[1];
      *puVar9 = plVar7;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_920);
      local_980 = &local_970;
      puVar18 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar18) {
        local_970 = *puVar18;
        lStack_968 = puVar9[3];
      }
      else {
        local_970 = *puVar18;
        local_980 = (ulong *)*puVar9;
      }
      local_978 = puVar9[1];
      *puVar9 = puVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_980,(ulong)(rel_name->_M_dataplus)._M_p);
      local_8c0 = &local_8b0;
      puVar18 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar18) {
        local_8b0 = *puVar18;
        lStack_8a8 = puVar9[3];
      }
      else {
        local_8b0 = *puVar18;
        local_8c0 = (ulong *)*puVar9;
      }
      local_8b8 = puVar9[1];
      *puVar9 = puVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_8c0);
      local_900 = &local_8f0;
      puVar18 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar18) {
        local_8f0 = *puVar18;
        lStack_8e8 = puVar9[3];
      }
      else {
        local_8f0 = *puVar18;
        local_900 = (ulong *)*puVar9;
      }
      local_8f8 = puVar9[1];
      *puVar9 = puVar18;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)psVar19,(ulong)local_900);
      if (local_900 != &local_8f0) {
        operator_delete(local_900);
      }
      if (local_8c0 != &local_8b0) {
        operator_delete(local_8c0);
      }
      if (local_980 != &local_970) {
        operator_delete(local_980);
      }
      if (local_920 != &local_910) {
        operator_delete(local_920);
      }
      if (local_960 != &local_950) {
        operator_delete(local_960);
      }
      if (local_940 != &local_930) {
        operator_delete(local_940);
      }
      if (local_8e0 != &local_8d0) {
        operator_delete(local_8e0);
      }
      if (local_8a0 != &local_890) {
        operator_delete(local_8a0);
      }
      if (local_878 != &local_868) {
        operator_delete(local_878);
      }
      if (local_810 != &local_800) {
        operator_delete(local_810);
      }
      if (local_838 != &local_828) {
        operator_delete(local_838);
      }
      if (local_858 != &local_848) {
        operator_delete(local_858);
      }
      if (local_7d8 != &local_7c8) {
        operator_delete(local_7d8);
      }
      uVar10 = 2;
    }
    lVar5 = local_778;
    if (uVar10 <= local_7f0) {
      do {
        uVar15 = this->groupViewsPerVarInfo[*local_7e0].
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5 + uVar10];
        local_7d8 = &local_7c8;
        std::__cxx11::string::_M_construct((ulong)&local_7d8,(char)*depth * '\x03' + '\f');
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_7d8,0,(char *)0x0,0x2afdd1);
        local_858 = &local_848;
        puVar18 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar18) {
          local_848 = *puVar18;
          lStack_840 = puVar9[3];
        }
        else {
          local_848 = *puVar18;
          local_858 = (ulong *)*puVar9;
        }
        local_850 = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_858);
        local_838 = &local_828;
        puVar18 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar18) {
          local_828 = *puVar18;
          lStack_820 = puVar9[3];
        }
        else {
          local_828 = *puVar18;
          local_838 = (ulong *)*puVar9;
        }
        local_830 = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_838,(ulong)this->viewName[uVar15]._M_dataplus._M_p);
        local_810 = &local_800;
        plVar7 = puVar9 + 2;
        if ((long *)*puVar9 == plVar7) {
          local_800 = *plVar7;
          lStack_7f8 = puVar9[3];
        }
        else {
          local_800 = *plVar7;
          local_810 = (long *)*puVar9;
        }
        local_808 = puVar9[1];
        *puVar9 = plVar7;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_810);
        local_878 = &local_868;
        puVar18 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar18) {
          local_868 = *puVar18;
          lStack_860 = puVar9[3];
        }
        else {
          local_868 = *puVar18;
          local_878 = (ulong *)*puVar9;
        }
        local_870 = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_878,(ulong)this->viewName[uVar15]._M_dataplus._M_p);
        local_8a0 = &local_890;
        plVar7 = puVar9 + 2;
        if ((long *)*puVar9 == plVar7) {
          local_890 = *plVar7;
          lStack_888 = puVar9[3];
        }
        else {
          local_890 = *plVar7;
          local_8a0 = (long *)*puVar9;
        }
        local_898 = puVar9[1];
        *puVar9 = plVar7;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_8a0);
        local_8e0 = &local_8d0;
        puVar18 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar18) {
          local_8d0 = *puVar18;
          lStack_8c8 = puVar9[3];
        }
        else {
          local_8d0 = *puVar18;
          local_8e0 = (ulong *)*puVar9;
        }
        local_8d8 = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8e0,(ulong)local_7b8);
        local_940 = &local_930;
        plVar7 = puVar9 + 2;
        if ((long *)*puVar9 == plVar7) {
          local_930 = *plVar7;
          lStack_928 = puVar9[3];
        }
        else {
          local_930 = *plVar7;
          local_940 = (long *)*puVar9;
        }
        local_938 = puVar9[1];
        *puVar9 = plVar7;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_940);
        local_960 = &local_950;
        puVar18 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar18) {
          local_950 = *puVar18;
          lStack_948 = puVar9[3];
        }
        else {
          local_950 = *puVar18;
          local_960 = (ulong *)*puVar9;
        }
        local_958 = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_960,(ulong)(local_818->_name)._M_dataplus._M_p);
        local_920 = &local_910;
        plVar7 = puVar9 + 2;
        if ((long *)*puVar9 == plVar7) {
          local_910 = *plVar7;
          lStack_908 = puVar9[3];
        }
        else {
          local_910 = *plVar7;
          local_920 = (long *)*puVar9;
        }
        local_918 = puVar9[1];
        *puVar9 = plVar7;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_920);
        local_980 = &local_970;
        puVar18 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar18) {
          local_970 = *puVar18;
          lStack_968 = puVar9[3];
        }
        else {
          local_970 = *puVar18;
          local_980 = (ulong *)*puVar9;
        }
        local_978 = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_980,(ulong)this->viewName[uVar15]._M_dataplus._M_p);
        psVar19 = local_880;
        local_8c0 = &local_8b0;
        puVar18 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar18) {
          local_8b0 = *puVar18;
          lStack_8a8 = puVar9[3];
        }
        else {
          local_8b0 = *puVar18;
          local_8c0 = (ulong *)*puVar9;
        }
        local_8b8 = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_8c0);
        local_900 = &local_8f0;
        puVar18 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar18) {
          local_8f0 = *puVar18;
          lStack_8e8 = puVar9[3];
        }
        else {
          local_8f0 = *puVar18;
          local_900 = (ulong *)*puVar9;
        }
        local_8f8 = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)psVar19,(ulong)local_900);
        if (local_900 != &local_8f0) {
          operator_delete(local_900);
        }
        if (local_8c0 != &local_8b0) {
          operator_delete(local_8c0);
        }
        if (local_980 != &local_970) {
          operator_delete(local_980);
        }
        if (local_920 != &local_910) {
          operator_delete(local_920);
        }
        if (local_960 != &local_950) {
          operator_delete(local_960);
        }
        if (local_940 != &local_930) {
          operator_delete(local_940);
        }
        if (local_8e0 != &local_8d0) {
          operator_delete(local_8e0);
        }
        if (local_8a0 != &local_890) {
          operator_delete(local_8a0);
        }
        if (local_878 != &local_868) {
          operator_delete(local_878);
        }
        if (local_810 != &local_800) {
          operator_delete(local_810);
        }
        if (local_838 != &local_828) {
          operator_delete(local_838);
        }
        if (local_858 != &local_848) {
          operator_delete(local_858);
        }
        if (local_7d8 != &local_7c8) {
          operator_delete(local_7d8);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 <= local_7f0);
    }
    std::__cxx11::string::pop_back();
    local_980 = &local_970;
    std::__cxx11::string::_M_construct((ulong)&local_980,(char)*depth * '\x03' + '\t');
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_980,0,(char *)0x0,0x2afdd1);
    pAVar16 = local_818;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_8b0 = *puVar18;
      lStack_8a8 = plVar7[3];
      local_8c0 = &local_8b0;
    }
    else {
      local_8b0 = *puVar18;
      local_8c0 = (ulong *)*plVar7;
    }
    local_8b8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_8c0);
    local_900 = &local_8f0;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_8f0 = *puVar18;
      lStack_8e8 = plVar7[3];
    }
    else {
      local_8f0 = *puVar18;
      local_900 = (ulong *)*plVar7;
    }
    local_8f8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)psVar19,(ulong)local_900);
    if (local_900 != &local_8f0) {
      operator_delete(local_900);
    }
    if (local_8c0 != &local_8b0) {
      operator_delete(local_8c0);
    }
    if (local_980 != &local_970) {
      operator_delete(local_980);
    }
    local_670 = &local_660;
    std::__cxx11::string::_M_construct((ulong)&local_670,(char)*depth * '\x03' + '\x06');
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_670);
    plVar7 = puVar9 + 2;
    if ((long *)*puVar9 == plVar7) {
      local_6a0 = *plVar7;
      lStack_698 = puVar9[3];
      local_6b0 = &local_6a0;
    }
    else {
      local_6a0 = *plVar7;
      local_6b0 = (long *)*puVar9;
    }
    local_6a8 = puVar9[1];
    *puVar9 = plVar7;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_6b0,(ulong)(pAVar16->_name)._M_dataplus._M_p);
    plVar7 = puVar9 + 2;
    if ((long *)*puVar9 == plVar7) {
      local_680 = *plVar7;
      lStack_678 = puVar9[3];
      local_690 = &local_680;
    }
    else {
      local_680 = *plVar7;
      local_690 = (long *)*puVar9;
    }
    local_688 = puVar9[1];
    *puVar9 = plVar7;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_690);
    local_750 = &local_740;
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_740 = *puVar18;
      lStack_738 = puVar9[3];
    }
    else {
      local_740 = *puVar18;
      local_750 = (ulong *)*puVar9;
    }
    local_748 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_750,(ulong)(pAVar16->_name)._M_dataplus._M_p);
    local_710 = &local_700;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_700 = *puVar14;
      uStack_6f8 = puVar9[3];
    }
    else {
      local_700 = *puVar14;
      local_710 = (undefined8 *)*puVar9;
    }
    local_708 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_710);
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_7c8 = *puVar18;
      lStack_7c0 = puVar9[3];
      local_7d8 = &local_7c8;
    }
    else {
      local_7c8 = *puVar18;
      local_7d8 = (ulong *)*puVar9;
    }
    local_7d0 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    cVar17 = '\x01';
    if (9 < local_7f0) {
      uVar15 = local_7f0;
      cVar6 = '\x04';
      do {
        cVar17 = cVar6;
        if (uVar15 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_0027a3ae;
        }
        if (uVar15 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_0027a3ae;
        }
        if (uVar15 < 10000) goto LAB_0027a3ae;
        bVar4 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar6 = cVar17 + '\x04';
      } while (bVar4);
      cVar17 = cVar17 + '\x01';
    }
LAB_0027a3ae:
    local_770 = &local_760;
    std::__cxx11::string::_M_construct((ulong)&local_770,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_770,(uint)local_768,local_7f0);
    uVar10 = 0xf;
    if (local_7d8 != &local_7c8) {
      uVar10 = local_7c8;
    }
    if (uVar10 < (ulong)(local_768 + local_7d0)) {
      uVar10 = 0xf;
      if (local_770 != &local_760) {
        uVar10 = local_760;
      }
      if (uVar10 < (ulong)(local_768 + local_7d0)) goto LAB_0027a439;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_770,0,(char *)0x0,(ulong)local_7d8);
    }
    else {
LAB_0027a439:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7d8,(ulong)local_770);
    }
    local_858 = &local_848;
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_848 = *puVar18;
      lStack_840 = puVar9[3];
    }
    else {
      local_848 = *puVar18;
      local_858 = (ulong *)*puVar9;
    }
    local_850 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)puVar18 = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_858);
    local_838 = &local_828;
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_828 = *puVar18;
      lStack_820 = puVar9[3];
    }
    else {
      local_828 = *puVar18;
      local_838 = (ulong *)*puVar9;
    }
    local_830 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_838,(ulong)local_798._M_dataplus._M_p);
    local_810 = &local_800;
    plVar7 = puVar9 + 2;
    if ((long *)*puVar9 == plVar7) {
      local_800 = *plVar7;
      lStack_7f8 = puVar9[3];
    }
    else {
      local_800 = *plVar7;
      local_810 = (long *)*puVar9;
    }
    local_808 = puVar9[1];
    *puVar9 = plVar7;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_810);
    local_878 = &local_868;
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_868 = *puVar18;
      lStack_860 = puVar9[3];
    }
    else {
      local_868 = *puVar18;
      local_878 = (ulong *)*puVar9;
    }
    local_870 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_878,(ulong)local_798._M_dataplus._M_p);
    local_8a0 = &local_890;
    plVar7 = puVar9 + 2;
    if ((long *)*puVar9 == plVar7) {
      local_890 = *plVar7;
      lStack_888 = puVar9[3];
    }
    else {
      local_890 = *plVar7;
      local_8a0 = (long *)*puVar9;
    }
    local_898 = puVar9[1];
    *puVar9 = plVar7;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_8a0);
    local_8e0 = &local_8d0;
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_8d0 = *puVar18;
      lStack_8c8 = puVar9[3];
    }
    else {
      local_8d0 = *puVar18;
      local_8e0 = (ulong *)*puVar9;
    }
    local_8d8 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_6d0 = &local_6c0;
    std::__cxx11::string::_M_construct((ulong)&local_6d0,(char)*depth * '\x03' + '\t');
    uVar10 = 0xf;
    if (local_8e0 != &local_8d0) {
      uVar10 = local_8d0;
    }
    if (uVar10 < (ulong)(local_6c8 + local_8d8)) {
      uVar10 = 0xf;
      if (local_6d0 != &local_6c0) {
        uVar10 = local_6c0;
      }
      if (uVar10 < (ulong)(local_6c8 + local_8d8)) goto LAB_0027a743;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_6d0,0,(char *)0x0,(ulong)local_8e0);
    }
    else {
LAB_0027a743:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8e0,(ulong)local_6d0);
    }
    local_940 = &local_930;
    plVar7 = puVar9 + 2;
    if ((long *)*puVar9 == plVar7) {
      local_930 = *plVar7;
      lStack_928 = puVar9[3];
    }
    else {
      local_930 = *plVar7;
      local_940 = (long *)*puVar9;
    }
    local_938 = puVar9[1];
    *puVar9 = plVar7;
    puVar9[1] = 0;
    *(undefined1 *)plVar7 = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_940);
    local_960 = &local_950;
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_950 = *puVar18;
      lStack_948 = puVar9[3];
    }
    else {
      local_950 = *puVar18;
      local_960 = (ulong *)*puVar9;
    }
    local_958 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_6f0 = &local_6e0;
    std::__cxx11::string::_M_construct((ulong)&local_6f0,(char)*depth * '\x03' + '\f');
    uVar10 = 0xf;
    if (local_960 != &local_950) {
      uVar10 = local_950;
    }
    if (uVar10 < (ulong)(local_6e8 + local_958)) {
      uVar10 = 0xf;
      if (local_6f0 != &local_6e0) {
        uVar10 = local_6e0;
      }
      if (uVar10 < (ulong)(local_6e8 + local_958)) goto LAB_0027a87d;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_6f0,0,(char *)0x0,(ulong)local_960);
    }
    else {
LAB_0027a87d:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_960,(ulong)local_6f0);
    }
    local_920 = &local_910;
    plVar7 = puVar9 + 2;
    if ((long *)*puVar9 == plVar7) {
      local_910 = *plVar7;
      lStack_908 = puVar9[3];
    }
    else {
      local_910 = *plVar7;
      local_920 = (long *)*puVar9;
    }
    local_918 = puVar9[1];
    *puVar9 = plVar7;
    puVar9[1] = 0;
    *(undefined1 *)plVar7 = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_920);
    local_980 = &local_970;
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_970 = *puVar18;
      lStack_968 = puVar9[3];
    }
    else {
      local_970 = *puVar18;
      local_980 = (ulong *)*puVar9;
    }
    local_978 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_730 = &local_720;
    std::__cxx11::string::_M_construct((ulong)&local_730,(char)*depth * '\x03' + '\t');
    uVar10 = 0xf;
    if (local_980 != &local_970) {
      uVar10 = local_970;
    }
    if (uVar10 < (ulong)(local_728 + local_978)) {
      uVar10 = 0xf;
      if (local_730 != &local_720) {
        uVar10 = local_720;
      }
      if (uVar10 < (ulong)(local_728 + local_978)) goto LAB_0027a9b2;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_730,0,(char *)0x0,(ulong)local_980);
    }
    else {
LAB_0027a9b2:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_980,(ulong)local_730);
    }
    local_8c0 = &local_8b0;
    puVar18 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar18) {
      local_8b0 = *puVar18;
      lStack_8a8 = puVar9[3];
    }
    else {
      local_8b0 = *puVar18;
      local_8c0 = (ulong *)*puVar9;
    }
    local_8b8 = puVar9[1];
    *puVar9 = puVar18;
    puVar9[1] = 0;
    *(undefined1 *)puVar18 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_8c0);
    local_900 = &local_8f0;
    puVar18 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar18) {
      local_8f0 = *puVar18;
      lStack_8e8 = plVar7[3];
    }
    else {
      local_8f0 = *puVar18;
      local_900 = (ulong *)*plVar7;
    }
    local_8f8 = plVar7[1];
    *plVar7 = (long)puVar18;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_880,(ulong)local_900);
    if (local_900 != &local_8f0) {
      operator_delete(local_900);
    }
    if (local_8c0 != &local_8b0) {
      operator_delete(local_8c0);
    }
    if (local_730 != &local_720) {
      operator_delete(local_730);
    }
    if (local_980 != &local_970) {
      operator_delete(local_980);
    }
    if (local_920 != &local_910) {
      operator_delete(local_920);
    }
    if (local_6f0 != &local_6e0) {
      operator_delete(local_6f0);
    }
    if (local_960 != &local_950) {
      operator_delete(local_960);
    }
    if (local_940 != &local_930) {
      operator_delete(local_940);
    }
    if (local_6d0 != &local_6c0) {
      operator_delete(local_6d0);
    }
    if (local_8e0 != &local_8d0) {
      operator_delete(local_8e0);
    }
    if (local_8a0 != &local_890) {
      operator_delete(local_8a0);
    }
    if (local_878 != &local_868) {
      operator_delete(local_878);
    }
    if (local_810 != &local_800) {
      operator_delete(local_810);
    }
    if (local_838 != &local_828) {
      operator_delete(local_838);
    }
    if (local_858 != &local_848) {
      operator_delete(local_858);
    }
    if (local_770 != &local_760) {
      operator_delete(local_770);
    }
    pAVar16 = local_818;
    if (local_7d8 != &local_7c8) {
      operator_delete(local_7d8);
    }
    if (local_710 != &local_700) {
      operator_delete(local_710);
    }
    if (local_750 != &local_740) {
      operator_delete(local_750);
    }
    if (local_690 != &local_680) {
      operator_delete(local_690);
    }
    if (local_6b0 != &local_6a0) {
      operator_delete(local_6b0);
    }
    puVar18 = local_670;
    if (local_670 != &local_660) goto LAB_00278706;
  }
  local_940 = &local_930;
  std::__cxx11::string::_M_construct((ulong)&local_940,(char)*depth * '\x03' + '\x06');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_940);
  local_960 = &local_950;
  puVar18 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar18) {
    local_950 = *puVar18;
    lStack_948 = plVar7[3];
  }
  else {
    local_950 = *puVar18;
    local_960 = (ulong *)*plVar7;
  }
  local_958 = plVar7[1];
  *plVar7 = (long)puVar18;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_960,(ulong)(pAVar16->_name)._M_dataplus._M_p);
  local_920 = &local_910;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_910 = *plVar12;
    lStack_908 = plVar7[3];
  }
  else {
    local_910 = *plVar12;
    local_920 = (long *)*plVar7;
  }
  local_918 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_920);
  puVar18 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar18) {
    local_970 = *puVar18;
    lStack_968 = plVar7[3];
    local_980 = &local_970;
  }
  else {
    local_970 = *puVar18;
    local_980 = (ulong *)*plVar7;
  }
  local_978 = plVar7[1];
  *plVar7 = (long)puVar18;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_980,(ulong)(pAVar16->_name)._M_dataplus._M_p);
  puVar18 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar18) {
    local_8b0 = *puVar18;
    lStack_8a8 = puVar9[3];
    local_8c0 = &local_8b0;
  }
  else {
    local_8b0 = *puVar18;
    local_8c0 = (ulong *)*puVar9;
  }
  local_8b8 = puVar9[1];
  *puVar9 = puVar18;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_8c0);
  puVar18 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar18) {
    local_8f0 = *puVar18;
    lStack_8e8 = plVar7[3];
    local_900 = &local_8f0;
  }
  else {
    local_8f0 = *puVar18;
    local_900 = (ulong *)*plVar7;
  }
  local_8f8 = plVar7[1];
  *plVar7 = (long)puVar18;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_880,(ulong)local_900);
  if (local_900 != &local_8f0) {
    operator_delete(local_900);
  }
  if (local_8c0 != &local_8b0) {
    operator_delete(local_8c0);
  }
  if (local_980 != &local_970) {
    operator_delete(local_980);
  }
  if (local_920 != &local_910) {
    operator_delete(local_920);
  }
  if (local_960 != &local_950) {
    operator_delete(local_960);
  }
  if (local_940 != &local_930) {
    operator_delete(local_940);
  }
  local_8a0 = &local_890;
  std::__cxx11::string::_M_construct((ulong)&local_8a0,(char)*depth * '\x03' + '\x06');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_8a0);
  local_8e0 = &local_8d0;
  puVar18 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar18) {
    local_8d0 = *puVar18;
    lStack_8c8 = plVar7[3];
  }
  else {
    local_8d0 = *puVar18;
    local_8e0 = (ulong *)*plVar7;
  }
  local_8d8 = plVar7[1];
  *plVar7 = (long)puVar18;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_8e0,(ulong)(pAVar16->_name)._M_dataplus._M_p);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_930 = *plVar12;
    lStack_928 = plVar7[3];
    local_940 = &local_930;
  }
  else {
    local_930 = *plVar12;
    local_940 = (long *)*plVar7;
  }
  local_938 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_940);
  local_960 = &local_950;
  puVar18 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar18) {
    local_950 = *puVar18;
    lStack_948 = plVar7[3];
  }
  else {
    local_950 = *puVar18;
    local_960 = (ulong *)*plVar7;
  }
  local_958 = plVar7[1];
  *plVar7 = (long)puVar18;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_960,(ulong)(pAVar16->_name)._M_dataplus._M_p);
  local_920 = &local_910;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_910 = *plVar12;
    lStack_908 = plVar7[3];
  }
  else {
    local_910 = *plVar12;
    local_920 = (long *)*plVar7;
  }
  local_918 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_920);
  puVar18 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar18) {
    local_970 = *puVar18;
    lStack_968 = plVar7[3];
    local_980 = &local_970;
  }
  else {
    local_970 = *puVar18;
    local_980 = (ulong *)*plVar7;
  }
  local_978 = plVar7[1];
  *plVar7 = (long)puVar18;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar10 = local_7f0 - 1;
  cVar17 = '\x01';
  if (9 < uVar10) {
    uVar13 = uVar10;
    cVar6 = '\x04';
    do {
      cVar17 = cVar6;
      if (uVar13 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_00278bd0;
      }
      if (uVar13 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_00278bd0;
      }
      if (uVar13 < 10000) goto LAB_00278bd0;
      bVar4 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar6 = cVar17 + '\x04';
    } while (bVar4);
    cVar17 = cVar17 + '\x01';
  }
LAB_00278bd0:
  local_878 = &local_868;
  std::__cxx11::string::_M_construct((ulong)&local_878,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_878,(uint)local_870,uVar10);
  uVar10 = 0xf;
  if (local_980 != &local_970) {
    uVar10 = local_970;
  }
  if (uVar10 < (ulong)(local_870 + local_978)) {
    uVar10 = 0xf;
    if (local_878 != &local_868) {
      uVar10 = local_868;
    }
    if ((ulong)(local_870 + local_978) <= uVar10) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_878,0,(char *)0x0,(ulong)local_980);
      goto LAB_00278c6a;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_980,(ulong)local_878);
LAB_00278c6a:
  puVar18 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar18) {
    local_8b0 = *puVar18;
    lStack_8a8 = puVar9[3];
    local_8c0 = &local_8b0;
  }
  else {
    local_8b0 = *puVar18;
    local_8c0 = (ulong *)*puVar9;
  }
  local_8b8 = puVar9[1];
  *puVar9 = puVar18;
  puVar9[1] = 0;
  *(undefined1 *)puVar18 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_8c0);
  puVar18 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar18) {
    local_8f0 = *puVar18;
    lStack_8e8 = plVar7[3];
    local_900 = &local_8f0;
  }
  else {
    local_8f0 = *puVar18;
    local_900 = (ulong *)*plVar7;
  }
  local_8f8 = plVar7[1];
  *plVar7 = (long)puVar18;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_880,(ulong)local_900);
  if (local_900 != &local_8f0) {
    operator_delete(local_900);
  }
  if (local_8c0 != &local_8b0) {
    operator_delete(local_8c0);
  }
  if (local_878 != &local_868) {
    operator_delete(local_878);
  }
  if (local_980 != &local_970) {
    operator_delete(local_980);
  }
  if (local_920 != &local_910) {
    operator_delete(local_920);
  }
  if (local_960 != &local_950) {
    operator_delete(local_960);
  }
  psVar19 = local_880;
  if (local_940 != &local_930) {
    operator_delete(local_940);
  }
  if (local_8e0 != &local_8d0) {
    operator_delete(local_8e0);
  }
  if (local_8a0 != &local_890) {
    operator_delete(local_8a0);
  }
  local_8c0 = &local_8b0;
  std::__cxx11::string::_M_construct((ulong)&local_8c0,(char)*depth * '\x03' + '\x06');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_8c0);
  puVar18 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar18) {
    local_8f0 = *puVar18;
    lStack_8e8 = plVar7[3];
    local_900 = &local_8f0;
  }
  else {
    local_8f0 = *puVar18;
    local_900 = (ulong *)*plVar7;
  }
  local_8f8 = plVar7[1];
  *plVar7 = (long)puVar18;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar19,(ulong)local_900);
  if (local_900 != &local_8f0) {
    operator_delete(local_900);
  }
  if (local_8c0 != &local_8b0) {
    operator_delete(local_8c0);
  }
  if (local_7b8 != local_7a8) {
    operator_delete(local_7b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p);
  }
  return psVar19;
}

Assistant:

std::string CppGenerator::genGroupRelationOrdering(
    const std::string& rel_name, const size_t& depth, const size_t& group_id)
{
    // TODO: FIXME: add the case when there is only two or one reations
    std::string res = offset(2+depth)+
        "/*********** ORDERING RELATIONS *************/\n";

    Attribute* attr = _td->getAttribute(groupVariableOrder[group_id][depth]);

    const std::string& attr_name = attr->_name;
    const std::string attrType = typeToStr(attr->_type);
    const std::string depthString = std::to_string(depth);
    
    size_t idx = depth * (_qc->numberOfViews() + 2);
    size_t numberContributing = groupViewsPerVarInfo[group_id][idx];

    if (numberContributing == 2)
    {
        std::string first, firstID;
        if (groupViewsPerVarInfo[group_id][idx+1] == _qc->numberOfViews())
        {    
            first = rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name;
            firstID = rel_name+"_ID";
        }
        else
        {
            size_t viewID = groupViewsPerVarInfo[group_id][idx+1];
            first = viewName[viewID]+"[lowerptr_"+viewName[viewID]+
                "["+depthString+"]]."+attr_name;
            firstID = viewName[viewID]+"_ID";
        }
        size_t viewID = groupViewsPerVarInfo[group_id][idx+2];
        std::string second = viewName[viewID]+"[lowerptr_"+viewName[viewID]+
                "["+depthString+"]]."+attr_name;
        std::string secondID = viewName[viewID]+"_ID";

        res += offset(2+depth)+"std::pair<"+attrType+", int> order_"+attr_name+"["+
            std::to_string(numberContributing)+"];\n"+
            offset(2+depth)+"if("+first+" < "+second+")\n"+offset(2+depth)+"{\n"+
            offset(3+depth)+"order_"+attr_name+"[0] = std::make_pair("+first+", "+
            firstID+");\n"+
            offset(3+depth)+"order_"+attr_name+"[1] = std::make_pair("+second+", "+
            secondID+");\n"+
            offset(2+depth)+"}\n"+
            offset(2+depth)+"else\n"+offset(2+depth)+"{\n"+
            offset(3+depth)+"order_"+attr_name+"[0] = std::make_pair("+second+", "+
            secondID+");\n"+
            offset(3+depth)+"order_"+attr_name+"[1] = std::make_pair("+first+", "+
            firstID+");\n"+
            offset(2+depth)+"}\n";
    }
    else
    {
        res += offset(2+depth)+"std::pair<"+attrType+", int> order_"+attr_name+"["+
            std::to_string(numberContributing)+"] = \n"+
            offset(3+depth)+"{";
        
        size_t off = 1;
        if (groupViewsPerVarInfo[group_id][idx+1] == _qc->numberOfViews())
        {
            res += "\n"+offset(4+depth)+"std::make_pair("+rel_name+
                "[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+", "+
                rel_name+"_ID),";
            off = 2;
        }
        
        for (; off <= numberContributing; ++off)
        {
            size_t viewID = groupViewsPerVarInfo[group_id][idx+off];
            res += "\n"+offset(4+depth)+"std::make_pair("+viewName[viewID]+
                "[lowerptr_"+viewName[viewID]+"["+depthString+"]]."+
                attr_name+", "+viewName[viewID]+"_ID),";
        }
        res.pop_back();
        res += "\n"+offset(3+depth)+"};\n";
    
        res += offset(2+depth)+"std::sort(order_"+attr_name+", order_"+attr_name+
            " + "+std::to_string(numberContributing)+",[](const std::pair<"+
            attrType+",int> &lhs, const std::pair<"+attrType+",int> &rhs)\n"+
            offset(3+depth)+"{\n"+offset(4+depth)+"return lhs.first < rhs.first;\n"+
            offset(3+depth)+"});\n";
    }
    

    res += offset(2+depth)+"min_"+attr_name+" = order_"+attr_name+"[0].first;\n";
    res += offset(2+depth)+"max_"+attr_name+" = order_"+attr_name+"["+
        std::to_string(numberContributing-1)+"].first;\n";

    res += offset(2+depth)+"/*********** ORDERING RELATIONS *************/\n";
    return res;
}